

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

void __thiscall wallet::SQLiteBatch::SetupSQLStatements(SQLiteBatch *this)

{
  int iVar1;
  runtime_error *this_00;
  sqlite3_stmt **args;
  pointer ppVar2;
  long in_FS_OFFSET;
  initializer_list<std::pair<sqlite3_stmt_**,_const_char_*>_> __l;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  statements;
  undefined8 local_98;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  local_90;
  undefined1 local_78 [32];
  sqlite3_stmt **local_58;
  char *local_50;
  sqlite3_stmt **local_48;
  char *local_40;
  sqlite3_stmt **local_38;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = &this->m_read_stmt;
  local_78._8_8_ = "SELECT value FROM main WHERE key = ?";
  local_78._16_8_ = &this->m_insert_stmt;
  local_78._24_8_ = "INSERT INTO main VALUES(?, ?)";
  local_58 = &this->m_overwrite_stmt;
  local_50 = "INSERT or REPLACE into main values(?, ?)";
  local_48 = &this->m_delete_stmt;
  local_40 = "DELETE FROM main WHERE key = ?";
  local_38 = &this->m_delete_prefix_stmt;
  local_30 = "DELETE FROM main WHERE instr(key, ?) = 1";
  __l._M_len = 5;
  __l._M_array = (iterator)local_78;
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::vector(&local_90,__l,(allocator_type *)&local_98);
  ppVar2 = local_90.
           super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar2 == local_90.
                  super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_90.
          super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.
                        super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
LAB_001c1b48:
      __stack_chk_fail();
    }
    args = ppVar2->first;
    if (*args == (sqlite3_stmt *)0x0) {
      iVar1 = sqlite3_prepare_v2(this->m_database->m_db,ppVar2->second,0xffffffff,args,0);
      if (iVar1 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_98 = sqlite3_errstr(iVar1);
        tinyformat::format<char_const*>
                  ((string *)local_78,
                   (tinyformat *)"SQLiteDatabase: Failed to setup SQL statements: %s\n",
                   (char *)&local_98,(char **)args);
        std::runtime_error::runtime_error(this_00,(string *)local_78);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001c1b48;
      }
    }
    ppVar2 = ppVar2 + 1;
  } while( true );
}

Assistant:

void SQLiteBatch::SetupSQLStatements()
{
    const std::vector<std::pair<sqlite3_stmt**, const char*>> statements{
        {&m_read_stmt, "SELECT value FROM main WHERE key = ?"},
        {&m_insert_stmt, "INSERT INTO main VALUES(?, ?)"},
        {&m_overwrite_stmt, "INSERT or REPLACE into main values(?, ?)"},
        {&m_delete_stmt, "DELETE FROM main WHERE key = ?"},
        {&m_delete_prefix_stmt, "DELETE FROM main WHERE instr(key, ?) = 1"},
    };

    for (const auto& [stmt_prepared, stmt_text] : statements) {
        if (*stmt_prepared == nullptr) {
            int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, stmt_prepared, nullptr);
            if (res != SQLITE_OK) {
                throw std::runtime_error(strprintf(
                    "SQLiteDatabase: Failed to setup SQL statements: %s\n", sqlite3_errstr(res)));
            }
        }
    }
}